

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtable.c
# Opt level: O2

void checkARCAccessors(Class cls)

{
  byte *pbVar1;
  BOOL BVar2;
  Class poVar3;
  Class poVar4;
  Class poVar5;
  Class poVar6;
  
  BVar2 = class_isMetaClass(cls);
  if (BVar2 == '\0') {
    if (checkFastAllocInit_alloc == (SEL)0x0) {
      checkFastAllocInit_alloc = sel_registerName("alloc");
      checkFastAllocInit_allocWithZone = sel_registerName("allocWithZone:");
      checkFastAllocInit_init = sel_registerName("init");
      checkFastAllocInit_isTrivialAllocInit = sel_registerName("_TrivialAllocInit");
    }
    poVar3 = cls->isa;
    poVar4 = ownerForMethod(poVar3,checkFastAllocInit_isTrivialAllocInit);
    if (poVar4 == (Class)0x0) {
      pbVar1 = (byte *)((long)&cls->info + 1);
      *pbVar1 = *pbVar1 & 0x7f;
      pbVar1 = (byte *)((long)&poVar3->info + 1);
      *pbVar1 = *pbVar1 & 0x7f;
    }
    else {
      poVar5 = ownerForMethod(poVar3,checkFastAllocInit_alloc);
      poVar6 = ownerForMethod(poVar3,checkFastAllocInit_allocWithZone);
      if ((poVar5 == (Class)0x0 || poVar5 == poVar4) && (poVar6 == (Class)0x0 || poVar6 == poVar4))
      {
        pbVar1 = (byte *)((long)&poVar3->info + 1);
        *pbVar1 = *pbVar1 | 0x80;
      }
      else {
        pbVar1 = (byte *)((long)&poVar3->info + 1);
        *pbVar1 = *pbVar1 & 0x7f;
      }
      poVar3 = ownerForMethod(cls,checkFastAllocInit_init);
      if ((poVar3 == (Class)0x0) || (poVar3->isa == poVar4)) {
        pbVar1 = (byte *)((long)&cls->info + 1);
        *pbVar1 = *pbVar1 | 0x80;
      }
      else {
        pbVar1 = (byte *)((long)&cls->info + 1);
        *pbVar1 = *pbVar1 & 0x7f;
      }
    }
  }
  if (checkARCAccessors::retain == (SEL)0x0) {
    checkARCAccessors::retain = sel_registerName("retain");
    checkARCAccessors::release = sel_registerName("release");
    checkARCAccessors::autorelease = sel_registerName("autorelease");
    checkARCAccessors::isARC = sel_registerName("_ARCCompliantRetainRelease");
  }
  poVar3 = ownerForMethod(cls,checkARCAccessors::retain);
  if ((((poVar3 == (Class)0x0) ||
       (BVar2 = ownsMethod(poVar3,checkARCAccessors::isARC), BVar2 != '\0')) &&
      ((poVar3 = ownerForMethod(cls,checkARCAccessors::release), poVar3 == (Class)0x0 ||
       (BVar2 = ownsMethod(poVar3,checkARCAccessors::isARC), BVar2 != '\0')))) &&
     ((poVar3 = ownerForMethod(cls,checkARCAccessors::autorelease), poVar3 == (Class)0x0 ||
      (BVar2 = ownsMethod(poVar3,checkARCAccessors::isARC), BVar2 != '\0')))) {
    pbVar1 = (byte *)((long)&cls->info + 1);
    *pbVar1 = *pbVar1 | 8;
  }
  else {
    pbVar1 = (byte *)((long)&cls->info + 1);
    *pbVar1 = *pbVar1 & 0xf7;
  }
  return;
}

Assistant:

static void checkARCAccessors(Class cls)
{
	checkFastAllocInit(cls);
	static SEL retain, release, autorelease, isARC;
	if (NULL == retain)
	{
		retain = sel_registerName("retain");
		release = sel_registerName("release");
		autorelease = sel_registerName("autorelease");
		isARC = sel_registerName("_ARCCompliantRetainRelease");
	}
	Class owner = ownerForMethod(cls, retain);
	if ((NULL != owner) && !ownsMethod(owner, isARC))
	{
		ARC_DEBUG_LOG("%s does not support ARC correctly (implements retain)\n", cls->name);
		objc_clear_class_flag(cls, objc_class_flag_fast_arc);
		return;
	}
	owner = ownerForMethod(cls, release);
	if ((NULL != owner) && !ownsMethod(owner, isARC))
	{
		ARC_DEBUG_LOG("%s does not support ARC correctly (implements release)\n", cls->name);
		objc_clear_class_flag(cls, objc_class_flag_fast_arc);
		return;
	}
	owner = ownerForMethod(cls, autorelease);
	if ((NULL != owner) && !ownsMethod(owner, isARC))
	{
		ARC_DEBUG_LOG("%s does not support ARC correctly (implements autorelease)\n", cls->name);
		objc_clear_class_flag(cls, objc_class_flag_fast_arc);
		return;
	}
	objc_set_class_flag(cls, objc_class_flag_fast_arc);
}